

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest::BuildFile
          (AllowUnknownDependenciesTest *this,FileDescriptorProto *proto)

{
  DescriptorPoolMode DVar1;
  ParamType *pPVar2;
  FileDescriptor *pFVar3;
  undefined8 *puVar4;
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  string_view name;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  string local_48;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
           ::GetParam();
  DVar1 = (pPVar2->
          super__Tuple_impl<0UL,_google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>
          ).super__Head_base<0UL,_google::protobuf::descriptor_unittest::DescriptorPoolMode,_false>.
          _M_head_impl;
  if (DVar1 == FALLBACK_DATABASE) {
    local_28[0] = (internal)SimpleDescriptorDatabase::Add(&this->db_,proto);
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_28[0]) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,local_28,(AssertionResult *)"db_.Add(proto)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xe0d,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_20,local_20);
    }
    puVar4 = (undefined8 *)
             ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    name._M_str = (char *)*puVar4;
    name._M_len = puVar4[1];
    pFVar3 = DescriptorPool::FindFileByName
                       ((this->pool_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                        .super__Head_base<0UL,_google::protobuf::DescriptorPool_*,_false>.
                        _M_head_impl,name);
    return pFVar3;
  }
  if (DVar1 == NO_DATABASE) {
    pFVar3 = DescriptorPool::BuildFile
                       ((this->pool_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                        .super__Head_base<0UL,_google::protobuf::DescriptorPool_*,_false>.
                        _M_head_impl,proto);
    return pFVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,0xe11);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            ((LogMessage *)&local_48,(char (*) [16])"Can\'t get here.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_48);
}

Assistant:

const FileDescriptor* BuildFile(const FileDescriptorProto& proto) {
    switch (mode()) {
      case NO_DATABASE:
        return pool_->BuildFile(proto);
        break;
      case FALLBACK_DATABASE: {
        EXPECT_TRUE(db_.Add(proto));
        return pool_->FindFileByName(proto.name());
      }
    }
    ABSL_LOG(FATAL) << "Can't get here.";
    return nullptr;
  }